

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makemon.c
# Opt level: O3

void bagotricks_monster(obj *bag,boolean use_charge)

{
  bool bVar1;
  uint uVar2;
  monst *pmVar3;
  int iVar4;
  
  if (use_charge != '\0') {
    consume_obj_charge(bag,'\x01');
  }
  uVar2 = mt_random();
  iVar4 = 1;
  if (uVar2 * -0x1642c859 < 0xb21642d) {
    uVar2 = mt_random();
    iVar4 = uVar2 % 7 + 2;
  }
  uVar2 = iVar4 + 1;
  bVar1 = false;
  do {
    pmVar3 = makemon((permonst *)0x0,level,(int)u.ux,(int)u.uy,0);
    if (pmVar3 != (monst *)0x0) {
      bVar1 = true;
    }
    uVar2 = uVar2 - 1;
  } while (1 < uVar2);
  if (bVar1) {
    discover_object(0xe1,'\x01','\x01');
    return;
  }
  return;
}

Assistant:

void bagotricks_monster(struct obj *bag, boolean use_charge)
{
	int cnt = 1;
	boolean gotone = FALSE;

	if (use_charge)
	    consume_obj_charge(bag, TRUE);

	if (!rn2(23))
	    cnt += rn1(7, 1);
	while (cnt-- > 0) {
	    if (makemon(NULL, level, u.ux, u.uy, NO_MM_FLAGS))
		gotone = TRUE;
	}
	if (gotone)
	    makeknown(BAG_OF_TRICKS);
}